

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyLTY.hpp
# Opt level: O2

void njoy::ENDFtk::section::DerivedRedundant::verifyLTY(int LTY)

{
  undefined8 *puVar1;
  char *unaff_RBX;
  
  if (LTY == 0) {
    return;
  }
  tools::Log::error<char_const*>(unaff_RBX);
  tools::Log::info<char_const*>(unaff_RBX);
  tools::Log::info<char_const*,int>("LTY value: {}",LTY);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyLTY( int LTY ) {

  if ( LTY != 0 ) {

      Log::error( "Encountered illegal LTY value" );
      Log::info( "LTY must be 0 for DerivedRedundant" );
      Log::info( "LTY value: {}", LTY );
      throw std::exception();
  }
}